

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O2

Matrix3d *
RigidBodyDynamics::Body::TransformInertiaToBodyFrame
          (Matrix3d *__return_storage_ptr__,SpatialTransform *transform,Body *initial_body)

{
  double *pdVar1;
  Vector3d initial_com;
  Matrix3d inertia_initial_com_rotated;
  Matrix3d inertia_initial_com;
  Matrix3d inertia_initial;
  SpatialRigidBodyInertia initial_rbi;
  Vector3d local_2b0;
  SpatialTransform *local_298;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_290;
  SpatialTransform *local_288;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *local_280 [3];
  Scalar local_268;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_260;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_250;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_238 [2];
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> local_1f0 [72];
  SpatialRigidBodyInertia local_1a8;
  SpatialTransform *local_158;
  Vector3d *local_150;
  Vector3d *local_148;
  undefined4 uStack_140;
  uint uStack_13c;
  undefined8 local_138;
  double local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  double local_120;
  undefined8 local_118;
  
  local_148 = &transform->r;
  local_158 = transform;
  local_150 = &initial_body->mCenterOfMass;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_2b0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_158);
  Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (&local_1a8,initial_body->mMass,&initial_body->mCenterOfMass,&initial_body->mInertia);
  Math::SpatialRigidBodyInertia::toMatrix((SpatialMatrix *)&local_158,&local_1a8);
  local_220 = 0;
  uStack_218 = 0;
  local_210 = 6;
  local_238[0] = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_158;
  local_228 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_158;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>>
            (local_1f0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>_> *)
             local_238);
  local_130 = (initial_body->mCenterOfMass).super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  local_158 = (SpatialTransform *)0x0;
  local_138 = 0;
  local_120 = -local_130;
  pdVar1 = (initial_body->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1;
  local_128 = *(undefined4 *)pdVar1;
  uStack_124 = *(undefined4 *)
                ((long)(initial_body->mCenterOfMass).super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + 0xc);
  uStack_140 = *(undefined4 *)
                ((initial_body->mCenterOfMass).super_Vector3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                + 2);
  uStack_13c = *(uint *)((long)(initial_body->mCenterOfMass).super_Vector3d.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array + 0x14) ^ 0x80000000;
  local_148 = (Vector3d *)((ulong)*pdVar1 ^ 0x8000000000000000);
  local_118 = 0;
  local_268 = initial_body->mMass;
  local_280[0] = local_1f0;
  local_260 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_158;
  local_250 = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_158;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_238,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
              *)local_280);
  local_298 = transform;
  local_290 = (PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_238;
  local_288 = transform;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_280,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_298);
  Math::parallel_axis(__return_storage_ptr__,(Matrix3d *)local_280,initial_body->mMass,&local_2b0);
  return __return_storage_ptr__;
}

Assistant:

static Math::Matrix3d TransformInertiaToBodyFrame(const Math::SpatialTransform &transform,
                                                    const Body &initial_body)
  {
    Math::Vector3d initial_com = transform.E.transpose() * initial_body.mCenterOfMass +
                               transform.r;

    Math::SpatialRigidBodyInertia initial_rbi =
      Math::SpatialRigidBodyInertia::createFromMassComInertiaC (initial_body.mMass,
          initial_body.mCenterOfMass, initial_body.mInertia);

    Math::Matrix3d inertia_initial = initial_rbi.toMatrix().block<3,3>(0,0);
    LOG << "inertia_initial = " << std::endl << inertia_initial << std::endl;

    // 1. Transform the inertia from initial origin to initial COM
    Math::Matrix3d initial_com_cross = Math::VectorCrossMatrix(
                                       initial_body.mCenterOfMass);
    Math::Matrix3d inertia_initial_com = inertia_initial - initial_body.mMass * initial_com_cross
                                       * initial_com_cross.transpose();
    LOG << "inertia_initial_com = " << std::endl << inertia_initial_com << std::endl;

    // 2. Rotate the inertia that it is aligned to the frame of this body
    Math::Matrix3d inertia_initial_com_rotated = transform.E.transpose() *
        inertia_initial_com * transform.E;
    LOG << "inertia_initial_com_rotated = " << std::endl << inertia_initial_com_rotated
        << std::endl;

    // 3. Transform inertia of initial_body to the origin of the frame of the target body
    Math::Matrix3d inertia_initial_com_rotated_this_origin = Math::parallel_axis (
          inertia_initial_com_rotated, initial_body.mMass, initial_com);
    LOG << "inertia_initial_com_rotated_this_origin = " << std::endl <<
        inertia_initial_com_rotated_this_origin << std::endl;
    return inertia_initial_com_rotated_this_origin;
  }